

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.h
# Opt level: O0

optional<pbrt::BSDFSample> * __thiscall
pbrt::BSDF::Sample_f
          (BSDF *this,Vector3f woRender,Float u,Point2f u2,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  Point2f u_00;
  Vector3f v;
  Vector3f wo_00;
  undefined1 uVar4;
  bool bVar5;
  BxDFFlags a;
  int iVar6;
  BSDF *this_00;
  BSDFSample *pBVar7;
  BxDFReflTransFlags in_ECX;
  undefined8 in_RDI;
  optional<pbrt::BSDFSample> *this_01;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [56];
  float fVar10;
  undefined1 in_ZMM3 [64];
  Vector3f VVar11;
  Tuple3<pbrt::Vector3,_float> TVar12;
  optional<pbrt::BSDFSample> bs;
  Vector3f wo;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  SampledSpectrum *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe90;
  BxDFReflTransFlags sampleFlags_00;
  undefined8 in_stack_fffffffffffffe98;
  BSDF *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  undefined4 uVar13;
  undefined4 uVar14;
  float fVar15;
  optional local_b0 [48];
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  undefined8 local_60;
  undefined8 local_50;
  float local_48;
  BxDFReflTransFlags local_44;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_18;
  undefined1 auVar8 [64];
  
  sampleFlags_00 = (BxDFReflTransFlags)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  fVar10 = (float)in_RDI;
  uVar13 = (undefined4)((ulong)in_RDI >> 0x20);
  local_70 = vmovlpd_avx(in_ZMM0._0_16_);
  local_30 = vmovlpd_avx(in_ZMM3._0_16_);
  auVar9 = ZEXT856(0);
  VVar11.super_Tuple3<pbrt::Vector3,_float>.y._3_1_ = in_stack_fffffffffffffebf;
  VVar11.super_Tuple3<pbrt::Vector3,_float>._0_7_ = in_stack_fffffffffffffeb8;
  VVar11.super_Tuple3<pbrt::Vector3,_float>.z = fVar10;
  uVar14 = uVar13;
  fVar15 = fVar10;
  local_60 = local_70;
  local_44 = in_ECX;
  local_28 = local_70;
  local_18 = local_70;
  VVar11 = RenderToLocal(in_stack_fffffffffffffea0,VVar11);
  local_78 = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar9;
  local_80 = vmovlpd_avx(auVar8._0_16_);
  local_50 = local_80;
  local_48 = local_78;
  if ((local_78 != 0.0) || (NAN(local_78))) {
    a = BxDF::Flags((BxDF *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    iVar6 = operator&(a,local_44);
    if (iVar6 != 0) {
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar14;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = fVar10;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar15;
      u_00.super_Tuple2<pbrt::Point2,_float>.y._3_1_ = in_stack_fffffffffffffeaf;
      u_00.super_Tuple2<pbrt::Point2,_float>._0_7_ = in_stack_fffffffffffffea8;
      BxDF::Sample_f(&in_stack_fffffffffffffea0->bxdf,wo_00,
                     (Float)((ulong)in_stack_fffffffffffffe98 >> 0x20),u_00,
                     (TransportMode)in_stack_fffffffffffffe98,sampleFlags_00);
      uVar4 = pstd::optional::operator_cast_to_bool(local_b0);
      bVar5 = pstd::optional::operator_cast_to_bool(local_b0);
      if (bVar5) {
        this_00 = (BSDF *)pstd::optional<pbrt::BSDFSample>::operator->
                                    ((optional<pbrt::BSDFSample> *)0x65820f);
        bVar5 = SampledSpectrum::operator_cast_to_bool(in_stack_fffffffffffffe78);
        if (!bVar5) goto LAB_0065827c;
        pBVar7 = pstd::optional<pbrt::BSDFSample>::operator->
                           ((optional<pbrt::BSDFSample> *)0x658233);
        if ((pBVar7->pdf == 0.0) && (!NAN(pBVar7->pdf))) goto LAB_0065827c;
        pBVar7 = pstd::optional<pbrt::BSDFSample>::operator->
                           ((optional<pbrt::BSDFSample> *)0x65825f);
        fVar1 = (pBVar7->wi).super_Tuple3<pbrt::Vector3,_float>.z;
        if ((fVar1 == 0.0) && (!NAN(fVar1))) goto LAB_0065827c;
        pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x6582b4);
        this_01 = (optional<pbrt::BSDFSample> *)0x0;
        v.super_Tuple3<pbrt::Vector3,_float>.y._3_1_ = uVar4;
        v.super_Tuple3<pbrt::Vector3,_float>._0_7_ = in_stack_fffffffffffffeb8;
        v.super_Tuple3<pbrt::Vector3,_float>.z = fVar10;
        TVar12 = (Tuple3<pbrt::Vector3,_float>)LocalToRender(this_00,v);
        fVar10 = TVar12.z;
        auVar3._8_8_ = this_01;
        auVar3._0_8_ = TVar12._0_8_;
        uVar2 = vmovlpd_avx(auVar3);
        pBVar7 = pstd::optional<pbrt::BSDFSample>::operator->
                           ((optional<pbrt::BSDFSample> *)0x65835b);
        (pBVar7->wi).super_Tuple3<pbrt::Vector3,_float>.z = fVar10;
        (pBVar7->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
        (pBVar7->wi).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
        pstd::optional<pbrt::BSDFSample>::optional(this_01,TVar12._0_8_);
      }
      else {
LAB_0065827c:
        memset((void *)CONCAT44(uVar14,fVar10),0,0x30);
        pstd::optional<pbrt::BSDFSample>::optional
                  ((optional<pbrt::BSDFSample> *)CONCAT44(uVar14,fVar10));
      }
      pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x6583a7);
      goto LAB_006583a7;
    }
  }
  memset((void *)CONCAT44(uVar14,fVar10),0,0x30);
  pstd::optional<pbrt::BSDFSample>::optional((optional<pbrt::BSDFSample> *)CONCAT44(uVar14,fVar10));
LAB_006583a7:
  return (optional<pbrt::BSDFSample> *)CONCAT44(uVar13,fVar15);
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<BSDFSample> Sample_f(
        Vector3f woRender, Float u, Point2f u2,
        TransportMode mode = TransportMode::Radiance,
        BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        Vector3f wo = RenderToLocal(woRender);
        if (wo.z == 0 || !(bxdf.Flags() & sampleFlags))
            return {};
        // Sample _bxdf_ and return _BSDFSample_
        pstd::optional<BSDFSample> bs = bxdf.Sample_f(wo, u, u2, mode, sampleFlags);
        if (bs)
            DCHECK_GE(bs->pdf, 0);
        if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
            return {};
        PBRT_DBG("For wo = (%f, %f, %f), ns %f %f %f sampled f = %f %f %f %f, pdf = %f, "
                 "ratio[0] = %f wi = (%f, %f, %f)\n",
                 wo.x, wo.y, wo.z, shadingFrame.z.x, shadingFrame.z.y, shadingFrame.z.z,
                 bs->f[0], bs->f[1], bs->f[2], bs->f[3], bs->pdf,
                 (bs->pdf > 0) ? (bs->f[0] / bs->pdf) : 0, bs->wi.x, bs->wi.y, bs->wi.z);
        bs->wi = LocalToRender(bs->wi);
        return bs;
    }